

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O0

MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
* __thiscall
vkt::sparse::anon_unknown_0::SparseAllocationBuilder::build
          (MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
           *__return_storage_ptr__,SparseAllocationBuilder *this,DeviceInterface *vk,VkDevice device
          ,Allocator *allocator,VkBufferCreateInfo referenceCreateInfo,VkDeviceSize minChunkSize)

{
  deUint32 dVar1;
  unsigned_long uVar2;
  VkMemoryRequirements requirements;
  RefData<vk::Handle<(vk::HandleType)8>_> data;
  undefined1 auVar3 [8];
  VkDeviceSize VVar4;
  bool bVar5;
  SparseAllocation *pSVar6;
  Handle<(vk::HandleType)8> *pHVar7;
  unsigned_long *puVar8;
  reference puVar9;
  pointer pMVar10;
  reference this_00;
  UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *this_01;
  VkDeviceSize VVar11;
  unsigned_long local_198;
  undefined1 local_190 [8];
  VkSparseMemoryBind bind;
  Allocation *alloc;
  __normal_iterator<const_vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind_*,_std::vector<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>_>
  local_158;
  const_iterator memBindIter;
  VkMemoryRequirements local_128;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_110;
  value_type local_100;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_f0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_e8;
  const_iterator numChunksIter;
  VkDeviceSize chunkSize;
  undefined1 auStack_c8 [8];
  VkMemoryRequirements memoryRequirements;
  Move<vk::Handle<(vk::HandleType)8>_> local_a0;
  RefData<vk::Handle<(vk::HandleType)8>_> local_80;
  undefined1 local_60 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> refBuffer;
  VkDeviceSize minChunkSize_local;
  Allocator *allocator_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  SparseAllocationBuilder *this_local;
  MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  *sparseAllocation;
  
  refBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._7_1_ = 0;
  pSVar6 = (SparseAllocation *)operator_new(0x40);
  (pSVar6->memoryBinds).
  super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar6->memoryBinds).
  super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pSVar6->allocations).
  super__Vector_base<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pSVar6->memoryBinds).
  super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar6->allocations).
  super__Vector_base<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar6->allocations).
  super__Vector_base<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)pSVar6 = 0;
  pSVar6->resourceSize = 0;
  SparseAllocation::SparseAllocation(pSVar6);
  de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>::DefaultDeleter
            ((DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation> *)
             ((long)&refBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                     m_allocator + 6));
  de::details::
  MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::MovePtr(__return_storage_ptr__,pSVar6);
  referenceCreateInfo.size = 4;
  ::vk::createBuffer(&local_a0,vk,device,&referenceCreateInfo,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_80,(Move *)&local_a0);
  data.deleter.m_deviceIface = local_80.deleter.m_deviceIface;
  data.object.m_internal = local_80.object.m_internal;
  data.deleter.m_device = local_80.deleter.m_device;
  data.deleter.m_allocator = local_80.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_60,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_a0);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_60);
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)auStack_c8,vk,device,(VkBuffer)pHVar7->m_internal);
  numChunksIter._M_current = (uint *)deAlign64(minChunkSize,memoryRequirements.size);
  puVar8 = std::max<unsigned_long>(&memoryRequirements.size,(unsigned_long *)&numChunksIter);
  uVar2 = *puVar8;
  local_e8._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (&this->m_chunksPerAllocation);
  while( true ) {
    local_f0._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           (&this->m_chunksPerAllocation);
    bVar5 = __gnu_cxx::operator!=(&local_e8,&local_f0);
    if (!bVar5) break;
    pSVar6 = de::details::
             UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
             ::operator->(&__return_storage_ptr__->
                           super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                         );
    VVar4 = memoryRequirements.alignment;
    VVar11 = memoryRequirements.size;
    auVar3 = auStack_c8;
    puVar9 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_e8);
    requirements.alignment = VVar11;
    requirements.size = (VkDeviceSize)auVar3;
    requirements._16_8_ = VVar4;
    requirementsWithSize(&local_128,requirements,*puVar9 * uVar2);
    memBindIter._M_current._4_4_ = ::vk::MemoryRequirement::Any;
    (*allocator->_vptr_Allocator[3])
              (&local_110,allocator,&local_128,(ulong)::vk::MemoryRequirement::Any);
    makeDeSharedPtr<vk::Allocation>((sparse *)&local_100,&local_110);
    std::
    vector<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>_>_>
    ::push_back(&pSVar6->allocations,&local_100);
    de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>::
    ~SharedPtr(&local_100);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr(&local_110);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_e8);
  }
  local_158._M_current =
       (MemoryBind *)
       std::
       vector<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
       ::begin(&this->m_memoryBinds);
  while( true ) {
    alloc = (Allocation *)
            std::
            vector<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
            ::end(&this->m_memoryBinds);
    bVar5 = __gnu_cxx::operator!=
                      (&local_158,
                       (__normal_iterator<const_vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind_*,_std::vector<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>_>
                        *)&alloc);
    if (!bVar5) break;
    pSVar6 = de::details::
             UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
             ::operator->(&__return_storage_ptr__->
                           super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                         );
    pMVar10 = __gnu_cxx::
              __normal_iterator<const_vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind_*,_std::vector<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>_>
              ::operator->(&local_158);
    this_00 = std::
              vector<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>_>_>
              ::operator[](&pSVar6->allocations,(ulong)pMVar10->allocationNdx);
    this_01 = &de::
               SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>
               ::operator*(this_00)->
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>;
    bind._32_8_ = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
                  operator*(this_01);
    pMVar10 = __gnu_cxx::
              __normal_iterator<const_vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind_*,_std::vector<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>_>
              ::operator->(&local_158);
    local_190 = (undefined1  [8])(pMVar10->resourceChunkNdx * uVar2);
    pMVar10 = __gnu_cxx::
              __normal_iterator<const_vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind_*,_std::vector<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>_>
              ::operator->(&local_158);
    bind.resourceOffset = pMVar10->numChunks * uVar2;
    bind.size = (VkDeviceSize)::vk::Allocation::getMemory((Allocation *)bind._32_8_);
    VVar11 = ::vk::Allocation::getOffset((Allocation *)bind._32_8_);
    pMVar10 = __gnu_cxx::
              __normal_iterator<const_vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind_*,_std::vector<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>_>
              ::operator->(&local_158);
    bind.memory.m_internal = VVar11 + pMVar10->memoryChunkNdx * uVar2;
    bind.memoryOffset._0_4_ = 0;
    pSVar6 = de::details::
             UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
             ::operator->(&__return_storage_ptr__->
                           super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                         );
    std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::push_back
              (&pSVar6->memoryBinds,(value_type *)local_190);
    local_198 = (long)local_190 + bind.resourceOffset;
    std::max<unsigned_long>(&referenceCreateInfo.size,&local_198);
    __gnu_cxx::
    __normal_iterator<const_vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind_*,_std::vector<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>_>
    ::operator++(&local_158);
  }
  VVar11 = referenceCreateInfo.size;
  pSVar6 = de::details::
           UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
           ::operator->(&__return_storage_ptr__->
                         super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                       );
  pSVar6->resourceSize = VVar11;
  dVar1 = this->m_resourceChunkNdx;
  pSVar6 = de::details::
           UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
           ::operator->(&__return_storage_ptr__->
                         super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                       );
  pSVar6->numResourceChunks = dVar1;
  refBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._7_1_ = 1;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_60);
  if ((refBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._7_1_ & 1)
      == 0) {
    de::details::
    MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
    ::~MovePtr(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MovePtr<SparseAllocation> SparseAllocationBuilder::build (const DeviceInterface&	vk,
														  const VkDevice			device,
														  Allocator&				allocator,
														  VkBufferCreateInfo		referenceCreateInfo,
														  const VkDeviceSize		minChunkSize) const
{

	MovePtr<SparseAllocation>	sparseAllocation			(new SparseAllocation());

								referenceCreateInfo.size	= sizeof(deUint32);
	const Unique<VkBuffer>		refBuffer					(createBuffer(vk, device, &referenceCreateInfo));
	const VkMemoryRequirements	memoryRequirements			= getBufferMemoryRequirements(vk, device, *refBuffer);
	const VkDeviceSize			chunkSize					= std::max(memoryRequirements.alignment, static_cast<VkDeviceSize>(deAlign64(minChunkSize, memoryRequirements.alignment)));

	for (std::vector<deUint32>::const_iterator numChunksIter = m_chunksPerAllocation.begin(); numChunksIter != m_chunksPerAllocation.end(); ++numChunksIter)
	{
		sparseAllocation->allocations.push_back(makeDeSharedPtr(
			allocator.allocate(requirementsWithSize(memoryRequirements, *numChunksIter * chunkSize), MemoryRequirement::Any)));
	}

	for (std::vector<MemoryBind>::const_iterator memBindIter = m_memoryBinds.begin(); memBindIter != m_memoryBinds.end(); ++memBindIter)
	{
		const Allocation&			alloc	= **sparseAllocation->allocations[memBindIter->allocationNdx];
		const VkSparseMemoryBind	bind	=
		{
			memBindIter->resourceChunkNdx * chunkSize,							// VkDeviceSize               resourceOffset;
			memBindIter->numChunks * chunkSize,									// VkDeviceSize               size;
			alloc.getMemory(),													// VkDeviceMemory             memory;
			alloc.getOffset() + memBindIter->memoryChunkNdx * chunkSize,		// VkDeviceSize               memoryOffset;
			(VkSparseMemoryBindFlags)0,											// VkSparseMemoryBindFlags    flags;
		};
		sparseAllocation->memoryBinds.push_back(bind);
		referenceCreateInfo.size = std::max(referenceCreateInfo.size, bind.resourceOffset + bind.size);
	}

	sparseAllocation->resourceSize		= referenceCreateInfo.size;
	sparseAllocation->numResourceChunks = m_resourceChunkNdx;

	return sparseAllocation;
}